

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers_test.cpp
# Opt level: O0

void __thiscall BVHLightSampling_PdfMethod_Test::TestBody(BVHLightSampling_PdfMethod_Test *this)

{
  undefined1 auVar1 [16];
  span<const_pbrt::LightHandle> lights_00;
  bool bVar2;
  float fVar3;
  undefined4 uVar4;
  Type type;
  AssertionResult gtest_ar;
  float in_stack_000000e8;
  float in_stack_000000ec;
  optional<pbrt::SampledLight> sampledLight;
  Interaction intr;
  Float u;
  Point3f p;
  int i;
  BVHLightSampler distrib;
  vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_> tris;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> lights;
  anon_class_8_1_ba1d750b r;
  RNG rng;
  Allocator in_stack_000002d8;
  Interaction *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  Float in_stack_fffffffffffffd34;
  SampledLight *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  Float in_stack_fffffffffffffd44;
  SampledLight *in_stack_fffffffffffffd48;
  undefined7 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd57;
  Message *in_stack_fffffffffffffda8;
  AssertHelper *in_stack_fffffffffffffdb0;
  AssertionResult local_228 [4];
  optional local_1e8 [80];
  LightHandle *in_stack_fffffffffffffe68;
  LightSampleContext *in_stack_fffffffffffffe70;
  BVHLightSampler *in_stack_fffffffffffffe78;
  BVHLightSampler *in_stack_fffffffffffffe98;
  Allocator in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea8 [12];
  undefined4 in_stack_fffffffffffffeb4;
  Float in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  int iVar5;
  BVHLightSampler *in_stack_fffffffffffffec8;
  
  pbrt::RNG::RNG((RNG *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                 (uint64_t)in_stack_fffffffffffffd28);
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)0x52b910);
  std::vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>::vector
            ((vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_> *)0x52b91d);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)
             CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
  randomLights(this._4_4_,in_stack_000002d8);
  std::
  tie<std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>,std::vector<pbrt::ShapeHandle,std::allocator<pbrt::ShapeHandle>>>
            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
             in_stack_fffffffffffffd38,
             (vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_> *)
             CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
  std::
  tuple<std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>&,std::vector<pbrt::ShapeHandle,std::allocator<pbrt::ShapeHandle>>&>
  ::operator=((tuple<std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_&,_std::vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>_&>
               *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
              (tuple<std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>,_std::vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>_>
               *)in_stack_fffffffffffffd28);
  std::
  tuple<std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>,_std::vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>_>
  ::~tuple((tuple<std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>,_std::vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>_>
            *)0x52b98e);
  pstd::span<pbrt::LightHandle_const>::
  span<std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>,void,std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>>
            ((span<const_pbrt::LightHandle> *)
             CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
             (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
             in_stack_fffffffffffffd38);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)
             CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
  lights_00.n._4_4_ = in_stack_fffffffffffffeb4;
  lights_00._0_12_ = in_stack_fffffffffffffea8;
  pbrt::BVHLightSampler::BVHLightSampler
            (in_stack_fffffffffffffe98,lights_00,in_stack_fffffffffffffea0);
  for (iVar5 = 0; iVar5 < 100; iVar5 = iVar5 + 1) {
    fVar3 = TestBody::anon_class_8_1_ba1d750b::operator()((anon_class_8_1_ba1d750b *)0x52b9fa);
    auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),ZEXT416((uint)fVar3),
                             SUB6416(ZEXT464(0xbf800000),0));
    uVar4 = auVar1._0_4_;
    fVar3 = TestBody::anon_class_8_1_ba1d750b::operator()((anon_class_8_1_ba1d750b *)0x52ba30);
    auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),ZEXT416((uint)fVar3),
                             SUB6416(ZEXT464(0xbf800000),0));
    type = auVar1._0_4_;
    fVar3 = TestBody::anon_class_8_1_ba1d750b::operator()((anon_class_8_1_ba1d750b *)0x52ba66);
    vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),ZEXT416((uint)fVar3),
                    SUB6416(ZEXT464(0xbf800000),0));
    pbrt::Point3<float>::Point3
              ((Point3<float> *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
               (float)((ulong)in_stack_fffffffffffffd28 >> 0x20),SUB84(in_stack_fffffffffffffd28,0),
               0.0);
    pbrt::RNG::Uniform<float>((RNG *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
    pbrt::Point3fi::Point3fi
              ((Point3fi *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
               (Point3f *)in_stack_fffffffffffffd48);
    pbrt::Normal3<float>::Normal3
              ((Normal3<float> *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
               (float)((ulong)in_stack_fffffffffffffd28 >> 0x20),SUB84(in_stack_fffffffffffffd28,0),
               0.0);
    pbrt::Point2<float>::Point2
              ((Point2<float> *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
               (float)((ulong)in_stack_fffffffffffffd28 >> 0x20),SUB84(in_stack_fffffffffffffd28,0))
    ;
    pbrt::Interaction::Interaction
              ((Interaction *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
               (Point3fi *)in_stack_fffffffffffffd38,
               (Normal3f *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
               (Point2f *)in_stack_fffffffffffffd28);
    pbrt::LightSampleContext::LightSampleContext
              ((LightSampleContext *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
               in_stack_fffffffffffffd28);
    pbrt::BVHLightSampler::Sample
              (in_stack_fffffffffffffec8,
               (LightSampleContext *)CONCAT44(iVar5,in_stack_fffffffffffffec0),
               in_stack_fffffffffffffebc);
    in_stack_fffffffffffffd57 = pstd::optional::operator_cast_to_bool(local_1e8);
    if ((bool)in_stack_fffffffffffffd57) {
      in_stack_fffffffffffffd48 =
           pstd::optional<pbrt::SampledLight>::operator->((optional<pbrt::SampledLight> *)0x52bba4);
      in_stack_fffffffffffffd44 = in_stack_fffffffffffffd48->pdf;
      pbrt::LightSampleContext::LightSampleContext
                ((LightSampleContext *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30)
                 ,in_stack_fffffffffffffd28);
      in_stack_fffffffffffffd38 =
           pstd::optional<pbrt::SampledLight>::operator->((optional<pbrt::SampledLight> *)0x52bbdf);
      pbrt::LightHandle::LightHandle
                ((LightHandle *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                 (LightHandle *)in_stack_fffffffffffffd28);
      in_stack_fffffffffffffd34 =
           pbrt::BVHLightSampler::PDF
                     (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68)
      ;
      testing::internal::CmpHelperFloatingPointEQ<float>
                ((char *)sampledLight.optionalValue._8_8_,(char *)sampledLight.optionalValue.__align
                 ,in_stack_000000ec,in_stack_000000e8);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_228);
      in_stack_fffffffffffffd30 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffd30);
      if (!bVar2) {
        testing::Message::Message((Message *)CONCAT44(uVar4,fVar3));
        in_stack_fffffffffffffd28 =
             (Interaction *)testing::AssertionResult::failure_message((AssertionResult *)0x52bce1);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT44(uVar4,fVar3),type,
                   (char *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                   (int)((ulong)in_stack_fffffffffffffd48 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
        testing::Message::~Message((Message *)0x52bd2d);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x52bd7c);
    }
    pstd::optional<pbrt::SampledLight>::~optional((optional<pbrt::SampledLight> *)0x52bd9a);
  }
  pbrt::BVHLightSampler::~BVHLightSampler
            ((BVHLightSampler *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
  std::vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>::~vector
            ((vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_> *)
             CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~vector
            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
             CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  return;
}

Assistant:

TEST(BVHLightSampling, PdfMethod) {
    RNG rng(5251);
    auto r = [&rng]() { return rng.Uniform<Float>(); };

    std::vector<LightHandle> lights;
    std::vector<ShapeHandle> tris;
    std::tie(lights, tris) = randomLights(20, Allocator());

    BVHLightSampler distrib(lights, Allocator());
    for (int i = 0; i < 100; ++i) {
        Point3f p(-1 + 3 * r(), -1 + 3 * r(), -1 + 3 * r());
        Float u = rng.Uniform<Float>();
        Interaction intr(Point3fi(p), Normal3f(0, 0, 0), Point2f(0, 0));
        pstd::optional<SampledLight> sampledLight = distrib.Sample(intr, u);
        if (sampledLight)
            // It's actually legit to sometimes get no lights; as the bounds
            // tighten up as we get deeper in the tree, it may turn out that
            // the path we followed didn't have any lights after all.
            EXPECT_FLOAT_EQ(sampledLight->pdf, distrib.PDF(intr, sampledLight->light));
    }
}